

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O0

size_t __thiscall player_t::PropagateMark(player_t *this)

{
  player_t *this_local;
  
  GC::Mark<APlayerPawn>(&this->mo);
  GC::Mark<AActor>(&this->poisoner);
  GC::Mark<AActor>(&this->attacker);
  GC::Mark<AActor>(&this->camera);
  GC::Mark<DBot>(&this->Bot);
  GC::Mark<AWeapon>(&this->ReadyWeapon);
  GC::Mark<AActor>(&this->ConversationNPC);
  GC::Mark<AActor>(&this->ConversationPC);
  GC::Mark<AActor>(&this->MUSINFOactor);
  GC::Mark<AWeapon>(&this->PremorphWeapon);
  GC::Mark<DPSprite>(&this->psprites);
  if (this->PendingWeapon != (AWeapon *)AWeapon::RegistrationInfo.MyClass) {
    GC::Mark<AWeapon>(&this->PendingWeapon);
  }
  return 0x2a0;
}

Assistant:

size_t player_t::PropagateMark()
{
	GC::Mark(mo);
	GC::Mark(poisoner);
	GC::Mark(attacker);
	GC::Mark(camera);
	GC::Mark(Bot);
	GC::Mark(ReadyWeapon);
	GC::Mark(ConversationNPC);
	GC::Mark(ConversationPC);
	GC::Mark(MUSINFOactor);
	GC::Mark(PremorphWeapon);
	GC::Mark(psprites);
	if (PendingWeapon != WP_NOCHANGE)
	{
		GC::Mark(PendingWeapon);
	}
	return sizeof(*this);
}